

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceManager.cpp
# Opt level: O3

ResourceManager * ResourceManager::getInstance(void)

{
  if (rm != (ResourceManager *)0x0) {
    return rm;
  }
  rm = (ResourceManager *)operator_new(0x18);
  (rm->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (rm->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (rm->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return rm;
}

Assistant:

ResourceManager& ResourceManager::getInstance(void)
{
   if (!rm)
      rm = new ResourceManager();
   return *rm;
}